

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Batchnorm.cpp
# Opt level: O2

void CoreMLConverter::convertCaffeBatchnorm(ConvertLayerParameters layerParameters)

{
  RepeatedPtrField<caffe::LayerParameter> *this;
  uint new_size;
  string *psVar1;
  bool bVar2;
  __type _Var3;
  int iVar4;
  int iVar5;
  Type *caffeLayer;
  Type *pTVar6;
  Type *pTVar7;
  Type *pTVar8;
  Type *__rhs;
  ScaleParameter *pSVar9;
  Type *pTVar10;
  Type *pTVar11;
  NeuralNetworkLayer *this_00;
  BatchnormLayerParams *this_01;
  WeightParams *pWVar12;
  WeightParams *pWVar13;
  WeightParams *pWVar14;
  WeightParams *pWVar15;
  float *pfVar16;
  int i;
  uint uVar17;
  RepeatedField<float> *this_02;
  BatchNormParameter *pBVar18;
  RepeatedField<float> *this_03;
  RepeatedPtrField<caffe::BlobProto> *pRVar19;
  float fVar20;
  allocator local_121;
  float local_120;
  undefined4 local_11c;
  RepeatedField<float> mean;
  RepeatedField<float> variance;
  RepeatedField<float> beta;
  RepeatedField<float> gamma;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  string TopName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  
  iVar5 = *layerParameters.layerId;
  this = &(layerParameters.prototxt)->layer_;
  caffeLayer = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                         (&this->super_RepeatedPtrFieldBase,iVar5);
  iVar4 = getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                     (&((layerParameters.protoweights)->layer_).super_RepeatedPtrFieldBase,iVar4);
  if (((caffeLayer->bottom_).super_RepeatedPtrFieldBase.current_size_ != 1) ||
     ((caffeLayer->top_).super_RepeatedPtrFieldBase.current_size_ != 1)) {
    std::__cxx11::string::string
              ((string *)&TopName,"Must have 1 input and 1 output",(allocator *)&variance);
    psVar1 = (caffeLayer->name_).ptr_;
    std::__cxx11::string::string((string *)&mean,"BatchNorm",(allocator *)&bottom);
    errorInCaffeProto(&TopName,psVar1,(string *)&mean);
    std::__cxx11::string::~string((string *)&mean);
    std::__cxx11::string::~string((string *)&TopName);
  }
  local_11c = 0;
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(caffeLayer->top_).super_RepeatedPtrFieldBase,0);
  std::__cxx11::string::string((string *)&TopName,(string *)pTVar7);
  gamma.current_size_ = 0;
  gamma.total_size_ = 0;
  gamma.rep_ = (Rep *)0x0;
  beta.current_size_ = 0;
  beta.total_size_ = 0;
  beta.rep_ = (Rep *)0x0;
  if (iVar5 < ((layerParameters.prototxt)->layer_).super_RepeatedPtrFieldBase.current_size_ + -1) {
    pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                       (&this->super_RepeatedPtrFieldBase,iVar5 + 1);
    bVar2 = std::operator==((pTVar8->type_).ptr_,"Scale");
    if (bVar2) {
      pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                         (&this->super_RepeatedPtrFieldBase,iVar5 + 1);
      local_11c = 0;
      if (((pTVar8->bottom_).super_RepeatedPtrFieldBase.current_size_ != 1) ||
         ((pTVar8->top_).super_RepeatedPtrFieldBase.current_size_ != 1)) goto LAB_00474e5f;
      pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(pTVar8->bottom_).super_RepeatedPtrFieldBase,0);
      __rhs = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                        (&(caffeLayer->top_).super_RepeatedPtrFieldBase,0);
      _Var3 = std::operator==(pTVar7,__rhs);
      if (_Var3) {
        pSVar9 = pTVar8->scale_param_;
        if (pSVar9 == (ScaleParameter *)0x0) {
          pSVar9 = (ScaleParameter *)&caffe::_ScaleParameter_default_instance_;
        }
        if ((((pSVar9->axis_ == 1) || (pSVar9->axis_ == -3)) && (pSVar9->num_axes_ == 1)) &&
           (pSVar9->bias_term_ == true)) {
          iVar5 = getLayerIndex(pTVar8,layerParameters.mapCaffeLayerNamesToIndex);
          pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                              (&((layerParameters.protoweights)->layer_).super_RepeatedPtrFieldBase,
                               iVar5);
          if ((pTVar10->blobs_).super_RepeatedPtrFieldBase.current_size_ == 2) {
            pRVar19 = &pTVar10->blobs_;
            pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                                (&pRVar19->super_RepeatedPtrFieldBase,0);
            iVar5 = (pTVar11->data_).current_size_;
            pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                                (&pRVar19->super_RepeatedPtrFieldBase,1);
            iVar4 = (pTVar11->data_).current_size_;
            pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                                (&(pTVar6->blobs_).super_RepeatedPtrFieldBase,0);
            if ((pTVar11->data_).current_size_ == (uint)(iVar5 == iVar4)) {
              google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                        (&(pTVar8->top_).super_RepeatedPtrFieldBase,0);
              std::__cxx11::string::_M_assign((string *)&TopName);
              pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                                  (&pRVar19->super_RepeatedPtrFieldBase,0);
              google::protobuf::RepeatedField<float>::operator=(&gamma,&pTVar11->data_);
              pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                                  (&pRVar19->super_RepeatedPtrFieldBase,1);
              google::protobuf::RepeatedField<float>::operator=(&beta,&pTVar11->data_);
              *layerParameters.layerId = *layerParameters.layerId + 1;
              local_11c = (undefined4)CONCAT71(layerParameters.layerId._1_7_,1);
              goto LAB_00474e5f;
            }
          }
          local_11c = 0;
          goto LAB_00474e5f;
        }
      }
    }
    local_11c = 0;
  }
LAB_00474e5f:
  this_00 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                      (layerParameters.nnWrite);
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(caffeLayer->bottom_).super_RepeatedPtrFieldBase,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&bottom,pTVar7);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&top,&TopName);
  convertCaffeMetadata
            ((caffeLayer->name_).ptr_,&bottom,&top,layerParameters.nnWrite,
             layerParameters.mappingDataBlobNames);
  this_01 = CoreML::Specification::NeuralNetworkLayer::mutable_batchnorm(this_00);
  pBVar18 = caffeLayer->batch_norm_param_;
  if (pBVar18 == (BatchNormParameter *)0x0) {
    pBVar18 = (BatchNormParameter *)&caffe::_BatchNormParameter_default_instance_;
  }
  if ((pTVar6->blobs_).super_RepeatedPtrFieldBase.current_size_ != 3) {
    std::__cxx11::string::string
              ((string *)&mean,"Must have 3 weight blobs for mean, variance and scale",
               (allocator *)&local_120);
    psVar1 = (caffeLayer->name_).ptr_;
    std::__cxx11::string::string((string *)&variance,"BatchNorm",&local_121);
    errorInCaffeProto((string *)&mean,psVar1,(string *)&variance);
    std::__cxx11::string::~string((string *)&variance);
    std::__cxx11::string::~string((string *)&mean);
  }
  pRVar19 = &pTVar6->blobs_;
  pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                      (&pRVar19->super_RepeatedPtrFieldBase,0);
  new_size = (pTVar11->data_).current_size_;
  pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                      (&pRVar19->super_RepeatedPtrFieldBase,1);
  uVar17 = (pTVar11->data_).current_size_;
  if ((ulong)new_size == 0) {
    std::__cxx11::string::string((string *)&mean,"Empty mean vector blob",(allocator *)&local_120);
    psVar1 = (caffeLayer->name_).ptr_;
    std::__cxx11::string::string((string *)&variance,"BatchNorm",&local_121);
    errorInCaffeProto((string *)&mean,psVar1,(string *)&variance);
    std::__cxx11::string::~string((string *)&variance);
    std::__cxx11::string::~string((string *)&mean);
  }
  if (uVar17 == 0) {
    std::__cxx11::string::string
              ((string *)&mean,"Empty variance vector blob",(allocator *)&local_120);
    psVar1 = (caffeLayer->name_).ptr_;
    std::__cxx11::string::string((string *)&variance,"BatchNorm",&local_121);
    errorInCaffeProto((string *)&mean,psVar1,(string *)&variance);
    std::__cxx11::string::~string((string *)&variance);
    std::__cxx11::string::~string((string *)&mean);
  }
  if (uVar17 != new_size) {
    std::__cxx11::string::string
              ((string *)&mean,"Lengths of mean/variance vectors do not match",
               (allocator *)&local_120);
    psVar1 = (caffeLayer->name_).ptr_;
    std::__cxx11::string::string((string *)&variance,"BatchNorm",&local_121);
    errorInCaffeProto((string *)&mean,psVar1,(string *)&variance);
    std::__cxx11::string::~string((string *)&variance);
    std::__cxx11::string::~string((string *)&mean);
  }
  pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                      (&pRVar19->super_RepeatedPtrFieldBase,2);
  if ((pTVar11->data_).current_size_ == 0) {
    std::__cxx11::string::string((string *)&mean,"Empty scale factor blob",(allocator *)&local_120);
    psVar1 = (caffeLayer->name_).ptr_;
    std::__cxx11::string::string((string *)&variance,"BatchNorm",&local_121);
    errorInCaffeProto((string *)&mean,psVar1,(string *)&variance);
    std::__cxx11::string::~string((string *)&variance);
    std::__cxx11::string::~string((string *)&mean);
  }
  this_01->epsilon_ = pBVar18->eps_;
  if ((int)new_size < 0) {
    __assert_fail("C >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Batchnorm.cpp"
                  ,0x80,
                  "void CoreMLConverter::convertCaffeBatchnorm(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  this_01->channels_ = (ulong)new_size;
  pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                      (&pRVar19->super_RepeatedPtrFieldBase,2);
  fVar20 = caffe::BlobProto::data(pTVar11,0);
  pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                      (&pRVar19->super_RepeatedPtrFieldBase,0);
  google::protobuf::RepeatedField<float>::RepeatedField(&mean,&pTVar11->data_);
  pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                      (&pRVar19->super_RepeatedPtrFieldBase,1);
  google::protobuf::RepeatedField<float>::RepeatedField(&variance,&pTVar11->data_);
  pWVar12 = CoreML::Specification::BatchnormLayerParams::mutable_mean(this_01);
  pWVar13 = CoreML::Specification::BatchnormLayerParams::mutable_variance(this_01);
  pWVar14 = CoreML::Specification::BatchnormLayerParams::mutable_gamma(this_01);
  pWVar15 = CoreML::Specification::BatchnormLayerParams::mutable_beta(this_01);
  local_120 = 0.0;
  google::protobuf::RepeatedField<float>::Resize(&pWVar12->floatvalue_,new_size,&local_120);
  local_120 = 0.0;
  google::protobuf::RepeatedField<float>::Resize(&pWVar13->floatvalue_,new_size,&local_120);
  this_03 = &pWVar14->floatvalue_;
  local_120 = 0.0;
  google::protobuf::RepeatedField<float>::Resize(this_03,new_size,&local_120);
  this_02 = &pWVar15->floatvalue_;
  local_120 = 0.0;
  google::protobuf::RepeatedField<float>::Resize(this_02,new_size,&local_120);
  fVar20 = (float)(~-(uint)(fVar20 < 1e-05) & (uint)(1.0 / fVar20));
  for (uVar17 = 0; new_size != uVar17; uVar17 = uVar17 + 1) {
    pfVar16 = google::protobuf::RepeatedField<float>::Mutable(&mean,uVar17);
    local_120 = *pfVar16 * fVar20;
    google::protobuf::RepeatedField<float>::Set(&pWVar12->floatvalue_,uVar17,&local_120);
    pfVar16 = google::protobuf::RepeatedField<float>::Mutable(&variance,uVar17);
    local_120 = *pfVar16 * fVar20;
    google::protobuf::RepeatedField<float>::Set(&pWVar13->floatvalue_,uVar17,&local_120);
    if ((char)local_11c == '\0') {
      local_120 = 1.0;
      google::protobuf::RepeatedField<float>::Set(this_03,uVar17,&local_120);
      local_120 = 0.0;
      google::protobuf::RepeatedField<float>::Set(this_02,uVar17,&local_120);
    }
    else {
      pfVar16 = google::protobuf::RepeatedField<float>::Mutable(&gamma,uVar17);
      google::protobuf::RepeatedField<float>::Set(this_03,uVar17,pfVar16);
      pfVar16 = google::protobuf::RepeatedField<float>::Mutable(&beta,uVar17);
      google::protobuf::RepeatedField<float>::Set(this_02,uVar17,pfVar16);
    }
  }
  google::protobuf::RepeatedField<float>::~RepeatedField(&variance);
  google::protobuf::RepeatedField<float>::~RepeatedField(&mean);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&top);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&bottom);
  google::protobuf::RepeatedField<float>::~RepeatedField(&beta);
  google::protobuf::RepeatedField<float>::~RepeatedField(&gamma);
  std::__cxx11::string::~string((string *)&TopName);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeBatchnorm(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    /*
     If Batchnorm layer is followed by a Scale layer, we try to fuse the two into 1 CoreML Batchnorm layer (its more efficient).
     */
    
    bool fuseScale = false;
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    int layerIdWeights = CoreMLConverter::getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
    const caffe::LayerParameter& caffeLayerWeights = layerParameters.protoweights.layer(layerIdWeights);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and 1 output",caffeLayer.name(),"BatchNorm");
    }
    
    std::string TopName = caffeLayer.top(0);
    ::google::protobuf::RepeatedField<float> gamma;
    ::google::protobuf::RepeatedField<float> beta;
    /*
     Check whether Scale layer is to be fused: several conditions must be satisfied
     */
    //check whether the current BN is not the last layer and that the next layer is a "Scale" layer
    if (layerId < layerParameters.prototxt.layer_size()-1 && layerParameters.prototxt.layer(layerId+1).type() == "Scale"){
        const caffe::LayerParameter& caffeScaleLayer = layerParameters.prototxt.layer(layerId+1);
        
        //check whether the Scale layer has 1 bottom and top. Its bottom must be same as BN layer's top,
        //so that we know for sure that they are connected.
        if (caffeScaleLayer.bottom_size() == 1 && caffeScaleLayer.top_size() == 1 &&
            caffeScaleLayer.bottom(0) == caffeLayer.top(0)){
            
            const caffe::ScaleParameter& caffeLayerParamsScale = caffeScaleLayer.scale_param();
            
            //check that the Scale layer only applies scale to the channel axis and that it also includes the bias term.
            if ((caffeLayerParamsScale.axis() == 1 || caffeLayerParamsScale.axis() == -3) &&
                caffeLayerParamsScale.num_axes() == 1 && caffeLayerParamsScale.bias_term()){
                
                int layerIdWeightsScale = CoreMLConverter::getLayerIndex(caffeScaleLayer,layerParameters.mapCaffeLayerNamesToIndex);
                const caffe::LayerParameter& caffeScaleLayerWeights = layerParameters.protoweights.layer(layerIdWeightsScale);
                
                //check that the weights proto message corresponding to the scale layer is correct
                if (caffeScaleLayerWeights.blobs_size() == 2 &&
                    caffeScaleLayerWeights.blobs(0).data_size() == caffeScaleLayerWeights.blobs(1).data_size()
                    == caffeLayerWeights.blobs(0).data_size()){
                    
                    //All conditions are satisfied: Scale layer can now be fused with the BN layer.
                    fuseScale = true;
                    TopName = caffeScaleLayer.top(0);
                    gamma = caffeScaleLayerWeights.blobs(0).data();
                    beta = caffeScaleLayerWeights.blobs(1).data();
                    (*layerParameters.layerId)++;
                    //Succesfully fused batchNorm and scale layers.
                    
                }
            }
        }
    }
    
    #pragma unused(gamma)
    #pragma unused(beta)
    
    //Write Layer metadata
    ::google::protobuf::RepeatedPtrField< ::CoreML::Specification::NeuralNetworkLayer >* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    bottom.push_back(caffeLayer.bottom(0));
    top.push_back(TopName);
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(),
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    
    Specification::BatchnormLayerParams* specLayerParams = specLayer->mutable_batchnorm();
    const caffe::BatchNormParameter& caffeLayerParamsBN = caffeLayer.batch_norm_param();
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayerWeights.blobs_size()!=3) {
        CoreMLConverter::errorInCaffeProto("Must have 3 weight blobs for mean, variance and scale",caffeLayer.name(),"BatchNorm");
    }
    if (!caffeLayerParamsBN.use_global_stats()){
        /*
         WARNING: BatchNorm paramater 'use_global_stats' is False. It will be ignored during inference.
        The converter will look for mean/variance weights anyways. If they are not found, it will error out.
        */
    }
    //***************************************************************
    
    int C = caffeLayerWeights.blobs(0).data_size();
    int varianceLength = caffeLayerWeights.blobs(1).data_size();
    
    //****Some error checking in caffe file*************************
    if (C == 0){
        CoreMLConverter::errorInCaffeProto("Empty mean vector blob",caffeLayer.name(),"BatchNorm");
    }
    if (varianceLength == 0){
        CoreMLConverter::errorInCaffeProto("Empty variance vector blob",caffeLayer.name(),"BatchNorm");
    }
    if (varianceLength != C){
        CoreMLConverter::errorInCaffeProto("Lengths of mean/variance vectors do not match",caffeLayer.name(),"BatchNorm");
    }
    if (caffeLayerWeights.blobs(2).data_size() == 0){
        CoreMLConverter::errorInCaffeProto("Empty scale factor blob",caffeLayer.name(),"BatchNorm");
    }
    //***************************************************************
    
    specLayerParams->set_epsilon(caffeLayerParamsBN.eps());
    assert(C >= 0);
    specLayerParams->set_channels(static_cast<uint64_t>(C));
    float scale = caffeLayerWeights.blobs(2).data(0);
    float multiplicativeScale = (scale < 1e-5f) ? 0 : 1/scale;
    ::google::protobuf::RepeatedField<float> mean = caffeLayerWeights.blobs(0).data();
    ::google::protobuf::RepeatedField<float> variance = caffeLayerWeights.blobs(1).data();
    ::google::protobuf::RepeatedField<float>* meanWrite = specLayerParams->mutable_mean()->mutable_floatvalue();
    ::google::protobuf::RepeatedField<float>* varianceWrite = specLayerParams->mutable_variance()->mutable_floatvalue();
    ::google::protobuf::RepeatedField<float>* gammaWrite = specLayerParams->mutable_gamma()->mutable_floatvalue();
    ::google::protobuf::RepeatedField<float>* betaWrite = specLayerParams->mutable_beta()->mutable_floatvalue();
    meanWrite->Resize(C, 0.0);
    varianceWrite->Resize(C, 0.0);
    gammaWrite->Resize(C, 0.0);
    betaWrite->Resize(C, 0.0);
    for (int i=0; i<C; i++){
        meanWrite->Set(i,mean[i] * multiplicativeScale);
        varianceWrite->Set(i,variance[i] * multiplicativeScale);
        if (fuseScale){
            gammaWrite->Set(i, gamma[i]);
            betaWrite->Set(i, beta[i]);
        } else{
            gammaWrite->Set(i,1.0);
            betaWrite->Set(i,0.0);
        }
    }
}